

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  int number;
  Type TVar2;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar3;
  Label *v1;
  Label *v2;
  char *pcVar4;
  LogMessage *pLVar5;
  CppType *pCVar6;
  CppType *pCVar7;
  LogMessage local_a8;
  Voidify local_91;
  CppType local_90;
  CppType local_8c;
  Nullable<const_char_*> local_88;
  LogMessage local_80;
  Voidify local_69;
  Label local_68;
  Label local_64;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_48;
  Voidify local_31;
  CppType local_30;
  CppType local_2c;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  number = FieldDescriptor::number(descriptor);
  bVar1 = MaybeNewExtension(this,number,(FieldDescriptor *)extension,
                            (Extension **)&absl_log_internal_check_op_result);
  if (bVar1) {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)extension);
    absl_log_internal_check_op_result[8] = (char)TVar2;
    local_2c = internal::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_2c);
    local_30 = CPPTYPE_MESSAGE;
    pCVar7 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_30);
    local_28 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                         (pCVar6,pCVar7,
                          "cpp_type(extension->type) == FieldDescriptor::CPPTYPE_MESSAGE");
    if (local_28 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xd8,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    absl_log_internal_check_op_result[9] = '\x01';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
    pRVar3 = Arena::Create<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                       (this->arena_);
    *(RepeatedPtrField<google::protobuf::MessageLite> **)absl_log_internal_check_op_result = pRVar3;
  }
  else {
    local_64 = LABEL_OPTIONAL;
    if ((absl_log_internal_check_op_result[9] & 1U) != 0) {
      local_64 = LABEL_REPEATED;
    }
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_64);
    local_68 = LABEL_REPEATED;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_68);
    local_60 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                         (v1,v2,
                          "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_REPEATED"
                         );
    if (local_60 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xde,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_80);
    }
    local_8c = internal::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_8c);
    local_90 = CPPTYPE_MESSAGE;
    pCVar7 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_90);
    local_88 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                         (pCVar6,pCVar7,
                          "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    if (local_88 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_88);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xde,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
  }
  return (Extension *)absl_log_internal_check_op_result;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}